

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

WhereTerm * whereNthSubterm(WhereTerm *pTerm,int N)

{
  WhereTerm *local_28;
  int N_local;
  WhereTerm *pTerm_local;
  
  if (pTerm->eOperator == 0x400) {
    if (N < (((pTerm->u).pOrInfo)->wc).nTerm) {
      pTerm_local = (((pTerm->u).pOrInfo)->wc).a + N;
    }
    else {
      pTerm_local = (WhereTerm *)0x0;
    }
  }
  else {
    local_28 = pTerm;
    if (N != 0) {
      local_28 = (WhereTerm *)0x0;
    }
    pTerm_local = local_28;
  }
  return pTerm_local;
}

Assistant:

static WhereTerm *whereNthSubterm(WhereTerm *pTerm, int N){
  if( pTerm->eOperator!=WO_AND ){
    return N==0 ? pTerm : 0;
  }
  if( N<pTerm->u.pAndInfo->wc.nTerm ){
    return &pTerm->u.pAndInfo->wc.a[N];
  }
  return 0;
}